

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

void __thiscall ON_SHA1::AccumulateId(ON_SHA1 *this,ON_UUID *id)

{
  ON_UUID *id_local;
  ON_SHA1 *this_local;
  
  AccumulateBytes(this,id,0x10);
  return;
}

Assistant:

void ON_SHA1::AccumulateId(
  const ON_UUID& id
)
{
#if defined(ON_RUNTIME_WIN)
  if (ON::Endian() == ON::endian::little_endian)
  {
#endif
    AccumulateBytes(&id, sizeof(ON_UUID));
#if defined(ON_RUNTIME_WIN)
  }
  else
  {
    AccumulateUnsigned32(id.Data1);
    AccumulateUnsigned16(id.Data2);
    AccumulateUnsigned16(id.Data3);
    AccumulateBytes(id.Data4, 8);
  }
#endif
}